

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O1

int Map_NodeReadRefPhaseAct(Map_Node_t *pNode,int fPhase)

{
  int *piVar1;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Map_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mapper/mapperRefs.c"
                  ,0x2d,"int Map_NodeReadRefPhaseAct(Map_Node_t *, int)");
  }
  if (pNode->pCutBest[0] == (Map_Cut_t *)0x0) {
LAB_0040541b:
    if (pNode->pCutBest[1] == (Map_Cut_t *)0x0) {
      __assert_fail("pNode->pCutBest[0] || pNode->pCutBest[1]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mapper/mapperRefs.c"
                    ,0x30,"int Map_NodeReadRefPhaseAct(Map_Node_t *, int)");
    }
  }
  else {
    if (pNode->pCutBest[1] != (Map_Cut_t *)0x0) {
      piVar1 = pNode->nRefAct + fPhase;
      goto LAB_00405429;
    }
    if (pNode->pCutBest[0] == (Map_Cut_t *)0x0) goto LAB_0040541b;
  }
  piVar1 = pNode->nRefAct + 2;
LAB_00405429:
  return *piVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reads the actual reference counter of a phase.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Map_NodeReadRefPhaseAct( Map_Node_t * pNode, int fPhase )
{
    assert( !Map_IsComplement(pNode) );
    if ( pNode->pCutBest[0] && pNode->pCutBest[1] ) // both assigned
        return pNode->nRefAct[fPhase];
    assert( pNode->pCutBest[0] || pNode->pCutBest[1] ); // at least one assigned
    return pNode->nRefAct[2];
}